

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.cpp
# Opt level: O3

Error __thiscall
llvm::DWARFListTableHeader::extract
          (DWARFListTableHeader *this,DWARFDataExtractor Data,uint64_t *OffsetPtr)

{
  iterator __position;
  uint8_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  uint64_t *in_RDX;
  uint64_t *Vals_1;
  uint64_t *Vals_2;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  error_code EC_03;
  uint64_t local_48;
  uint64_t FullLength;
  uint64_t local_38;
  
  uVar10 = *in_RDX;
  OffsetPtr[6] = uVar10;
  if ((0xfffffffffffffffb < uVar10) || (Data.super_DataExtractor.Data.Length <= uVar10 + 3)) {
    pcVar6 = (char *)std::_V2::generic_category();
    local_48 = OffsetPtr[7];
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = this;
    createStringError<char_const*,unsigned_long>
              (EC,pcVar6,
               (char **)"section is not large enough to contain a %s table length at offset 0x%lx",
               &local_48);
    return (Error)(ErrorInfoBase *)this;
  }
  Vals_2 = OffsetPtr + 6;
  *(undefined1 *)(OffsetPtr + 5) = 0;
  FullLength._4_4_ = 4;
  uVar4 = DWARFDataExtractor::getRelocatedValue(&Data,4,in_RDX,(uint64_t *)0x0,(Error *)0x0);
  *OffsetPtr = uVar4;
  if (uVar4 == 0xffffffff) {
    *(undefined1 *)(OffsetPtr + 5) = 1;
    uVar4 = DataExtractor::getU64(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
    *OffsetPtr = uVar4;
    FullLength._4_4_ = 8;
  }
  else if (0xffffffe < uVar4 >> 4) {
    pcVar6 = (char *)std::_V2::generic_category();
    local_48 = OffsetPtr[7];
    Vals_1 = &local_48;
    pcVar7 = "%s table at offset 0x%lx has unsupported reserved unit length of value 0x%8.8lx";
    goto LAB_00d766df;
  }
  lVar9 = 4;
  if ((char)OffsetPtr[5] != '\0') {
    if ((char)OffsetPtr[5] != '\x01') {
      llvm_unreachable_internal
                ("Invalid Format value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                 ,0x23e);
    }
    lVar9 = 0xc;
  }
  uVar10 = lVar9 + uVar4;
  local_48 = uVar10;
  uVar4 = length((DWARFListTableHeader *)OffsetPtr);
  if (uVar10 != uVar4) {
    __assert_fail("FullLength == length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFListTable.cpp"
                  ,0x2a,"Error llvm::DWARFListTableHeader::extract(DWARFDataExtractor, uint64_t *)")
    ;
  }
  uVar5 = 0xc;
  if ((char)OffsetPtr[5] != '\0') {
    if ((char)OffsetPtr[5] != '\x01') goto LAB_00d7684c;
    uVar5 = 0x14;
  }
  if (uVar10 < uVar5) {
    pcVar6 = (char *)std::_V2::generic_category();
    local_38 = OffsetPtr[7];
    Vals_1 = &local_38;
    pcVar7 = "%s table at offset 0x%lx has too small length (0x%lx) to contain a complete header";
  }
  else {
    uVar5 = *Vals_2;
    if ((uVar5 <= uVar5 + uVar10) && ((uVar5 + uVar10) - 1 < Data.super_DataExtractor.Data.Length))
    {
      uVar2 = DataExtractor::getU16(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint16_t *)(OffsetPtr + 1) = uVar2;
      uVar1 = DataExtractor::getU8(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint8_t *)((long)OffsetPtr + 10) = uVar1;
      uVar1 = DataExtractor::getU8(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint8_t *)((long)OffsetPtr + 0xb) = uVar1;
      uVar3 = DataExtractor::getU32(&Data.super_DataExtractor,in_RDX,(Error *)0x0);
      *(uint32_t *)((long)OffsetPtr + 0xc) = uVar3;
      if ((short)OffsetPtr[1] != 5) {
        pcVar6 = (char *)std::_V2::generic_category();
        local_38 = OffsetPtr[7];
        EC_01._M_cat = (error_category *)0x16;
        EC_01._0_8_ = this;
        createStringError<char_const*,unsigned_short,unsigned_long>
                  (EC_01,pcVar6,(char **)"unrecognised %s table version %u in table at offset 0x%lx"
                   ,(unsigned_short *)&local_38,OffsetPtr + 1);
        return (Error)(ErrorInfoBase *)this;
      }
      uVar1 = *(uint8_t *)((long)OffsetPtr + 10);
      if ((uVar1 == '\x04') || (uVar1 == '\b')) {
        if (*(char *)((long)OffsetPtr + 0xb) == '\0') {
          lVar9 = 0xc;
          if ((char)OffsetPtr[5] != '\0') {
            if ((char)OffsetPtr[5] != '\x01') {
LAB_00d7684c:
              llvm_unreachable_internal
                        ("Invalid DWARF format (expected DWARF32 or DWARF64",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                         ,0x73);
            }
            lVar9 = 0x14;
          }
          if (uVar5 + uVar10 < OffsetPtr[6] + (ulong)(uVar3 * FullLength._4_4_) + lVar9) {
            pcVar6 = (char *)std::_V2::generic_category();
            local_38 = OffsetPtr[7];
            EC_03._M_cat = (error_category *)0x16;
            EC_03._0_8_ = this;
            createStringError<char_const*,unsigned_long,unsigned_int>
                      (EC_03,pcVar6,
                       (char **)
                       "%s table at offset 0x%lx has more offset entries (%u) than there is space for"
                       ,&local_38,(uint *)Vals_2);
            return (Error)(ErrorInfoBase *)this;
          }
          if (uVar3 != 0) {
            uVar8 = 0;
            Data.super_DataExtractor.AddressSize = uVar1;
            do {
              local_38 = DWARFDataExtractor::getRelocatedValue
                                   (&Data,FullLength._4_4_,in_RDX,(uint64_t *)0x0,(Error *)0x0);
              __position._M_current = (unsigned_long *)OffsetPtr[3];
              if (__position._M_current == (unsigned_long *)OffsetPtr[4]) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(OffsetPtr + 2),
                           __position,&local_38);
              }
              else {
                *__position._M_current = local_38;
                OffsetPtr[3] = (uint64_t)(__position._M_current + 1);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < *(uint *)((long)OffsetPtr + 0xc));
          }
          (this->HeaderData).Length = 1;
          return (Error)(ErrorInfoBase *)this;
        }
        pcVar6 = (char *)std::_V2::generic_category();
        local_38 = OffsetPtr[7];
        pcVar7 = "%s table at offset 0x%lx has unsupported segment selector size %u";
      }
      else {
        pcVar6 = (char *)std::_V2::generic_category();
        local_38 = OffsetPtr[7];
        pcVar7 = "%s table at offset 0x%lx has unsupported address size %u";
      }
      EC_02._M_cat = (error_category *)0x5f;
      EC_02._0_8_ = this;
      createStringError<char_const*,unsigned_long,unsigned_char>
                (EC_02,pcVar6,(char **)pcVar7,&local_38,(uchar *)Vals_2);
      return (Error)(ErrorInfoBase *)this;
    }
    pcVar6 = (char *)std::_V2::generic_category();
    local_38 = OffsetPtr[7];
    Vals_1 = &local_38;
    pcVar7 = "section is not large enough to contain a %s table of length 0x%lx at offset 0x%lx";
    Vals_2 = &local_48;
  }
LAB_00d766df:
  EC_00._M_cat = (error_category *)0x16;
  EC_00._0_8_ = this;
  createStringError<char_const*,unsigned_long,unsigned_long>
            (EC_00,pcVar6,(char **)pcVar7,Vals_1,Vals_2);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFListTableHeader::extract(DWARFDataExtractor Data,
                                    uint64_t *OffsetPtr) {
  HeaderOffset = *OffsetPtr;
  // Read and verify the length field.
  if (!Data.isValidOffsetForDataOfSize(*OffsetPtr, sizeof(uint32_t)))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a "
                       "%s table length at offset 0x%" PRIx64,
                       SectionName.data(), *OffsetPtr);
  Format = dwarf::DwarfFormat::DWARF32;
  uint8_t OffsetByteSize = 4;
  HeaderData.Length = Data.getRelocatedValue(4, OffsetPtr);
  if (HeaderData.Length == dwarf::DW_LENGTH_DWARF64) {
    Format = dwarf::DwarfFormat::DWARF64;
    OffsetByteSize = 8;
    HeaderData.Length = Data.getU64(OffsetPtr);
  } else if (HeaderData.Length >= dwarf::DW_LENGTH_lo_reserved) {
    return createStringError(errc::invalid_argument,
        "%s table at offset 0x%" PRIx64
        " has unsupported reserved unit length of value 0x%8.8" PRIx64,
        SectionName.data(), HeaderOffset, HeaderData.Length);
  }
  uint64_t FullLength =
      HeaderData.Length + dwarf::getUnitLengthFieldByteSize(Format);
  assert(FullLength == length());
  if (FullLength < getHeaderSize(Format))
    return createStringError(errc::invalid_argument,
                       "%s table at offset 0x%" PRIx64
                       " has too small length (0x%" PRIx64
                       ") to contain a complete header",
                       SectionName.data(), HeaderOffset, FullLength);
  uint64_t End = HeaderOffset + FullLength;
  if (!Data.isValidOffsetForDataOfSize(HeaderOffset, FullLength))
    return createStringError(errc::invalid_argument,
                       "section is not large enough to contain a %s table "
                       "of length 0x%" PRIx64 " at offset 0x%" PRIx64,
                       SectionName.data(), FullLength, HeaderOffset);

  HeaderData.Version = Data.getU16(OffsetPtr);
  HeaderData.AddrSize = Data.getU8(OffsetPtr);
  HeaderData.SegSize = Data.getU8(OffsetPtr);
  HeaderData.OffsetEntryCount = Data.getU32(OffsetPtr);

  // Perform basic validation of the remaining header fields.
  if (HeaderData.Version != 5)
    return createStringError(errc::invalid_argument,
                       "unrecognised %s table version %" PRIu16
                       " in table at offset 0x%" PRIx64,
                       SectionName.data(), HeaderData.Version, HeaderOffset);
  if (HeaderData.AddrSize != 4 && HeaderData.AddrSize != 8)
    return createStringError(errc::not_supported,
                       "%s table at offset 0x%" PRIx64
                       " has unsupported address size %" PRIu8,
                       SectionName.data(), HeaderOffset, HeaderData.AddrSize);
  if (HeaderData.SegSize != 0)
    return createStringError(errc::not_supported,
                       "%s table at offset 0x%" PRIx64
                       " has unsupported segment selector size %" PRIu8,
                       SectionName.data(), HeaderOffset, HeaderData.SegSize);
  if (End < HeaderOffset + getHeaderSize(Format) +
                HeaderData.OffsetEntryCount * OffsetByteSize)
    return createStringError(errc::invalid_argument,
        "%s table at offset 0x%" PRIx64 " has more offset entries (%" PRIu32
        ") than there is space for",
        SectionName.data(), HeaderOffset, HeaderData.OffsetEntryCount);
  Data.setAddressSize(HeaderData.AddrSize);
  for (uint32_t I = 0; I < HeaderData.OffsetEntryCount; ++I)
    Offsets.push_back(Data.getRelocatedValue(OffsetByteSize, OffsetPtr));
  return Error::success();
}